

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O0

matrix<int,_2UL> * trng::power<int,2ul>(matrix<int,_2UL> *a,unsigned_long_long m)

{
  ulong in_RDX;
  matrix<int,_2UL> *in_RDI;
  matrix_type powers;
  anon_class_1_0_00000001 unit;
  matrix_type *res;
  matrix<int,_2UL> *this;
  ulong local_18;
  
  this = in_RDI;
  matrix<int,2ul>::
  matrix<trng::power<int,2ul>(trng::matrix<int,2ul>const&,unsigned_long_long)::_lambda(unsigned_long,unsigned_long)_1_>
            ();
  matrix<int,_2UL>::matrix(this,in_RDI);
  local_18 = in_RDX;
  while (local_18 != 0) {
    if ((local_18 & 1) == 1) {
      operator*(a,(matrix<int,_2UL> *)m);
      matrix<int,_2UL>::operator=(this,in_RDI);
      matrix<int,_2UL>::~matrix((matrix<int,_2UL> *)0x404f2a);
    }
    local_18 = local_18 >> 1;
    if (local_18 == 0) break;
    operator*(a,(matrix<int,_2UL> *)m);
    matrix<int,_2UL>::operator=(this,in_RDI);
    matrix<int,_2UL>::~matrix((matrix<int,_2UL> *)0x404f9d);
  }
  matrix<int,_2UL>::~matrix((matrix<int,_2UL> *)0x404fb1);
  return this;
}

Assistant:

matrix<T, n> power(const matrix<T, n> &a, unsigned long long m) {
    using matrix_type = matrix<T, n>;
    using size_type = typename matrix_type::size_type;

    auto unit = [&](size_type i, size_type j) -> T { return i == j ? T{1} : T{0}; };
    matrix_type res(unit);
    matrix_type powers(a);
    while (m > 0) {
      if ((m & 1ull) == 1ull)
        res = res * powers;
      m >>= 1u;
      if (m == 0)
        break;
      powers = powers * powers;
    }
    return res;
  }